

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O1

UPropertySource uprops_getSource_63(UProperty which)

{
  UPropertySource UVar1;
  long lVar2;
  
  UVar1 = UPROPS_SRC_NONE;
  if (UCHAR_INVALID_CODE < which) {
    if (which < UCHAR_BINARY_LIMIT) {
      UVar1 = UPROPS_SRC_PROPSVEC;
      if (*(int *)((long)&binProps + (ulong)(uint)which * 0x10 + 4) == 0) {
        return *(UPropertySource *)(&binProps + (ulong)(uint)which * 2);
      }
    }
    else if (0xfff < which) {
      if (which < UCHAR_INT_LIMIT) {
        lVar2 = (ulong)(uint)(which + 0xfffff000) * 0x20;
        UVar1 = UPROPS_SRC_PROPSVEC;
        if (*(int *)(&DAT_003bf804 + lVar2) == 0) {
          return *(UPropertySource *)(&intProps + lVar2);
        }
      }
      else {
        if (which < UCHAR_AGE) {
          return (UPropertySource)((which & 0x7fffefff) == UCHAR_GENERAL_CATEGORY_MASK);
        }
        if (UCHAR_BIDI_PAIRED_BRACKET < which) {
          return (uint)(which == UCHAR_OTHER_PROPERTY_START) * 2;
        }
        if ((uint)(which + 0xffffc000) < 0xd) {
          return *(UPropertySource *)(&DAT_00344bbc + (ulong)(uint)(which + 0xffffc000) * 4);
        }
      }
    }
  }
  return UVar1;
}

Assistant:

U_CFUNC UPropertySource U_EXPORT2
uprops_getSource(UProperty which) {
    if(which<UCHAR_BINARY_START) {
        return UPROPS_SRC_NONE; /* undefined */
    } else if(which<UCHAR_BINARY_LIMIT) {
        const BinaryProperty &prop=binProps[which];
        if(prop.mask!=0) {
            return UPROPS_SRC_PROPSVEC;
        } else {
            return (UPropertySource)prop.column;
        }
    } else if(which<UCHAR_INT_START) {
        return UPROPS_SRC_NONE; /* undefined */
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        if(prop.mask!=0) {
            return UPROPS_SRC_PROPSVEC;
        } else {
            return (UPropertySource)prop.column;
        }
    } else if(which<UCHAR_STRING_START) {
        switch(which) {
        case UCHAR_GENERAL_CATEGORY_MASK:
        case UCHAR_NUMERIC_VALUE:
            return UPROPS_SRC_CHAR;

        default:
            return UPROPS_SRC_NONE;
        }
    } else if(which<UCHAR_STRING_LIMIT) {
        switch(which) {
        case UCHAR_AGE:
            return UPROPS_SRC_PROPSVEC;

        case UCHAR_BIDI_MIRRORING_GLYPH:
            return UPROPS_SRC_BIDI;

        case UCHAR_CASE_FOLDING:
        case UCHAR_LOWERCASE_MAPPING:
        case UCHAR_SIMPLE_CASE_FOLDING:
        case UCHAR_SIMPLE_LOWERCASE_MAPPING:
        case UCHAR_SIMPLE_TITLECASE_MAPPING:
        case UCHAR_SIMPLE_UPPERCASE_MAPPING:
        case UCHAR_TITLECASE_MAPPING:
        case UCHAR_UPPERCASE_MAPPING:
            return UPROPS_SRC_CASE;

        case UCHAR_ISO_COMMENT:
        case UCHAR_NAME:
        case UCHAR_UNICODE_1_NAME:
            return UPROPS_SRC_NAMES;

        default:
            return UPROPS_SRC_NONE;
        }
    } else {
        switch(which) {
        case UCHAR_SCRIPT_EXTENSIONS:
            return UPROPS_SRC_PROPSVEC;
        default:
            return UPROPS_SRC_NONE; /* undefined */
        }
    }
}